

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

void __thiscall
EVPTest_WycheproofRSAPKCS1Decrypt_Test::~EVPTest_WycheproofRSAPKCS1Decrypt_Test
          (EVPTest_WycheproofRSAPKCS1Decrypt_Test *this)

{
  EVPTest_WycheproofRSAPKCS1Decrypt_Test *this_local;
  
  ~EVPTest_WycheproofRSAPKCS1Decrypt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(EVPTest, WycheproofRSAPKCS1Decrypt) {
  RunWycheproofPKCS1DecryptTest(
      "third_party/wycheproof_testvectors/rsa_pkcs1_2048_test.txt");
  RunWycheproofPKCS1DecryptTest(
      "third_party/wycheproof_testvectors/rsa_pkcs1_3072_test.txt");
  RunWycheproofPKCS1DecryptTest(
      "third_party/wycheproof_testvectors/rsa_pkcs1_4096_test.txt");
}